

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall mkvparser::Segment::~Segment(Segment *this)

{
  long lVar1;
  long lVar2;
  Cluster *this_00;
  Tracks *this_01;
  SegmentInfo *this_02;
  Cues *this_03;
  Chapters *this_04;
  Tags *this_05;
  SeekHead *this_06;
  long lVar3;
  Cluster **ppCVar4;
  
  ppCVar4 = this->m_clusters;
  lVar1 = this->m_clusterCount;
  lVar2 = this->m_clusterPreloadCount;
  if (ppCVar4 != ppCVar4 + lVar1 + lVar2) {
    lVar3 = 0;
    do {
      this_00 = *(Cluster **)((long)ppCVar4 + lVar3);
      if (this_00 != (Cluster *)0x0) {
        Cluster::~Cluster(this_00);
      }
      operator_delete(this_00);
      lVar3 = lVar3 + 8;
    } while (lVar2 * 8 + lVar1 * 8 != lVar3);
    ppCVar4 = this->m_clusters;
  }
  if (ppCVar4 != (Cluster **)0x0) {
    operator_delete__(ppCVar4);
  }
  this_01 = this->m_pTracks;
  if (this_01 != (Tracks *)0x0) {
    Tracks::~Tracks(this_01);
  }
  operator_delete(this_01);
  this_02 = this->m_pInfo;
  if (this_02 != (SegmentInfo *)0x0) {
    SegmentInfo::~SegmentInfo(this_02);
  }
  operator_delete(this_02);
  this_03 = this->m_pCues;
  if (this_03 != (Cues *)0x0) {
    Cues::~Cues(this_03);
  }
  operator_delete(this_03);
  this_04 = this->m_pChapters;
  if (this_04 != (Chapters *)0x0) {
    Chapters::~Chapters(this_04);
  }
  operator_delete(this_04);
  this_05 = this->m_pTags;
  if (this_05 != (Tags *)0x0) {
    Tags::~Tags(this_05);
  }
  operator_delete(this_05);
  this_06 = this->m_pSeekHead;
  if (this_06 != (SeekHead *)0x0) {
    SeekHead::~SeekHead(this_06);
  }
  operator_delete(this_06);
  Cluster::~Cluster(&this->m_eos);
  return;
}

Assistant:

Segment::~Segment() {
  const long count = m_clusterCount + m_clusterPreloadCount;

  Cluster** i = m_clusters;
  Cluster** j = m_clusters + count;

  while (i != j) {
    Cluster* const p = *i++;
    delete p;
  }

  delete[] m_clusters;

  delete m_pTracks;
  delete m_pInfo;
  delete m_pCues;
  delete m_pChapters;
  delete m_pTags;
  delete m_pSeekHead;
}